

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rolledbitpacking.h
# Opt level: O0

void FastPForLib::__unpack_tight<9u,true>(uint32_t *in,uint32_t *out)

{
  bool bVar1;
  uint32_t uVar2;
  sbyte sVar3;
  uint *in_RSI;
  long in_RDI;
  uint32_t inword;
  uint32_t pointer;
  uint32_t t;
  uint local_18;
  uint *local_10;
  long local_8;
  
  bVar1 = false;
  local_10 = in_RSI;
  local_8 = in_RDI;
  while (!bVar1) {
    for (local_18 = 0; local_18 < 0x120; local_18 = local_18 + 9) {
      sVar3 = (sbyte)(local_18 & 0x1f);
      *local_10 = *(uint *)(local_8 + (ulong)(local_18 >> 5) * 4) >> sVar3;
      if (0x17 < (local_18 & 0x1f)) {
        *local_10 = *(int *)(local_8 + (ulong)((local_18 >> 5) + 1) * 4) << (0x20U - sVar3 & 0x1f) |
                    *local_10;
      }
      uVar2 = __bitmask<9u,true>(*local_10);
      *local_10 = uVar2;
      local_10 = local_10 + 1;
    }
    local_8 = local_8 + 0x24;
    bVar1 = true;
  }
  return;
}

Assistant:

void __unpack_tight(const uint32_t *__restrict__ in,
                    uint32_t *__restrict__ out) {
  assert(bit <= 32);
  if (bit == 32) {
    for (int k = 0; k < 32; ++k) {
      out[k] = in[k];
    }
    return;
  }
  if (bit == 16) {
    for (uint32_t outer = 0; outer < 16; ++outer) {
      for (uint32_t inwordpointer = 0; inwordpointer < 32; inwordpointer += 16)
        *(out++) = __bitmask<bit, mask>((*in) >> inwordpointer);
      ++in;
    }
    return;
  }
  if (bit == 8) {
    for (uint32_t outer = 0; outer < 8; ++outer) {
      for (uint32_t inwordpointer = 0; inwordpointer < 32; inwordpointer += 8)
        *(out++) = __bitmask<bit, mask>((*in) >> inwordpointer);
      ++in;
    }
    return;
  }

#if !defined(_MSC_VER) && !defined(__INTEL_COMPILER)
  enum { mygcd = gcd(bit, 32) };
#else
  const uint32_t mygcd = gcd(bit, 32);
#endif

  for (uint32_t t = 0; t < mygcd; ++t) {
    for (uint32_t pointer = 0; pointer < 32 * bit / mygcd; pointer += bit) {
      const uint32_t inword = (pointer % 32);
      *out = in[pointer / 32] >> inword;
      if (inword > 32 - bit)
        *out |= (in[pointer / 32 + 1] << (32 - inword));
      *out = __bitmask<bit, mask>(*out);
      ++out;
    }
    in += bit / mygcd;
  }
  return;
}